

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

bool read_input(bool filename_is_code,string *filename,string *input)

{
  string *in_RDX;
  string *in_RSI;
  byte in_DIL;
  bool ok;
  string *in_stack_00000270;
  string *in_stack_00000278;
  string *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffb7;
  string local_40;
  byte local_19;
  byte local_1;
  
  local_1 = in_DIL & 1;
  if (local_1 == 0) {
    in_stack_ffffffffffffffa8 = &local_40;
    std::__cxx11::string::string((string *)in_stack_ffffffffffffffa8,in_RSI);
    local_19 = read_input_content(in_stack_00000278,in_stack_00000270);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    std::__cxx11::string::operator=(in_RDX,in_RSI);
    local_19 = 1;
  }
  change_special_filename((bool)in_stack_ffffffffffffffb7,in_stack_ffffffffffffffa8);
  return (bool)(local_19 & 1);
}

Assistant:

bool read_input(
    bool filename_is_code, std::string *filename, std::string *input)
{
    bool ok;
    if (filename_is_code) {
        *input = *filename;
        ok = true;
    } else {
        ok = read_input_content(*filename, input);
    }
    // Let's change the filename to something we can show the user
    // if it is not a real filename.
    change_special_filename(filename_is_code, filename);
    return ok;
}